

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void * matras_alloc_range(matras *m,matras_id_t *id,matras_id_t range_count)

{
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  
  uVar1 = (m->head).block_count;
  if (m->capacity < uVar1) {
    __assert_fail("m->head.block_count <= m->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x133,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  uVar4 = (ulong)range_count;
  if (uVar1 % uVar4 != 0) {
    __assert_fail("m->head.block_count % range_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x134,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  if ((int)(((ulong)m->extent_size / (ulong)m->block_size) % (ulong)range_count) != 0) {
    __assert_fail("m->extent_size / m->block_size % range_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x135,"void *matras_alloc_range(struct matras *, matras_id_t *, matras_id_t)");
  }
  if ((uVar1 + uVar4 <= m->capacity) && (pvVar3 = matras_alloc_internal(m), pvVar3 != (void *)0x0))
  {
    sVar2 = (m->head).block_count;
    *id = (matras_id_t)sVar2;
    (m->head).block_count = uVar4 + sVar2;
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

void *
matras_alloc_range(struct matras *m, matras_id_t *id, matras_id_t range_count)
{
	assert(m->head.block_count <= m->capacity);
	assert(m->head.block_count % range_count == 0);
	assert(m->extent_size / m->block_size % range_count == 0);

	if (m->head.block_count + range_count > m->capacity) {
		/* No space left for range_count. */
		return NULL;
	}
	void *res = matras_alloc_internal(m);
	if (res != NULL) {
		*id = m->head.block_count;
		m->head.block_count += range_count;
	}
	return res;
}